

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O0

FT_Error FT_Bitmap_Copy(FT_Library library,FT_Bitmap *source,FT_Bitmap *target)

{
  int iVar1;
  int iVar2;
  size_t __n;
  size_t cur_count;
  FT_Free_Func p_Var3;
  FT_Free_Func local_78;
  FT_Byte *t;
  FT_Byte *s;
  FT_UInt i;
  uchar *p;
  FT_ULong target_size;
  FT_Int target_pitch;
  FT_Int target_pitch_sign;
  FT_Int source_pitch_sign;
  FT_ULong size;
  FT_Int pitch;
  FT_Error error;
  FT_Memory memory;
  FT_Bitmap *target_local;
  FT_Bitmap *source_local;
  FT_Library library_local;
  
  size._4_4_ = 0;
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else if ((source == (FT_Bitmap *)0x0) || (target == (FT_Bitmap *)0x0)) {
    library_local._4_4_ = 6;
  }
  else if (source == target) {
    library_local._4_4_ = 0;
  }
  else {
    iVar1 = 1;
    if (source->pitch < 0) {
      iVar1 = -1;
    }
    iVar2 = 1;
    if (target->pitch < 0) {
      iVar2 = -1;
    }
    memory = (FT_Memory)target;
    target_local = source;
    source_local = (FT_Bitmap *)library;
    if (source->buffer == (uchar *)0x0) {
      memcpy(target,source,0x28);
      if (iVar1 != iVar2) {
        *(int *)&memory->alloc = -*(int *)&memory->alloc;
      }
      library_local._4_4_ = 0;
    }
    else {
      _pitch = library->memory;
      size._0_4_ = source->pitch;
      if ((int)size < 0) {
        size._0_4_ = -(int)size;
      }
      __n = (long)(int)size * (ulong)source->rows;
      if (target->buffer == (uchar *)0x0) {
        p_Var3 = (FT_Free_Func)ft_mem_qalloc(_pitch,__n,(FT_Error *)((long)&size + 4));
        memory->free = p_Var3;
      }
      else {
        target_size._4_4_ = target->pitch;
        if (target_size._4_4_ < 0) {
          target_size._4_4_ = -target_size._4_4_;
        }
        cur_count = (long)target_size._4_4_ * (ulong)target->rows;
        if (cur_count != __n) {
          p_Var3 = (FT_Free_Func)
                   ft_mem_qrealloc(_pitch,1,cur_count,__n,target->buffer,
                                   (FT_Error *)((long)&size + 4));
          memory->free = p_Var3;
        }
      }
      if (size._4_4_ == 0) {
        p_Var3 = memory->free;
        memcpy(memory,target_local,0x28);
        memory->free = p_Var3;
        if (iVar1 == iVar2) {
          memcpy(memory->free,target_local->buffer,__n);
        }
        else {
          t = target_local->buffer;
          local_78 = memory->free + (long)(int)size * (ulong)(*(int *)&memory->user - 1);
          for (s._4_4_ = *(int *)&memory->user; s._4_4_ != 0; s._4_4_ = s._4_4_ + -1) {
            memcpy(local_78,t,(long)(int)size);
            t = t + (int)size;
            local_78 = local_78 + -(long)(int)size;
          }
        }
      }
      library_local._4_4_ = size._4_4_;
    }
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Copy( FT_Library        library,
                  const FT_Bitmap  *source,
                  FT_Bitmap        *target)
  {
    FT_Memory  memory;
    FT_Error   error  = FT_Err_Ok;

    FT_Int    pitch;
    FT_ULong  size;

    FT_Int  source_pitch_sign, target_pitch_sign;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !source || !target )
      return FT_THROW( Invalid_Argument );

    if ( source == target )
      return FT_Err_Ok;

    source_pitch_sign = source->pitch < 0 ? -1 : 1;
    target_pitch_sign = target->pitch < 0 ? -1 : 1;

    if ( !source->buffer )
    {
      *target = *source;
      if ( source_pitch_sign != target_pitch_sign )
        target->pitch = -target->pitch;

      return FT_Err_Ok;
    }

    memory = library->memory;
    pitch  = source->pitch;

    if ( pitch < 0 )
      pitch = -pitch;
    size = (FT_ULong)pitch * source->rows;

    if ( target->buffer )
    {
      FT_Int    target_pitch = target->pitch;
      FT_ULong  target_size;


      if ( target_pitch < 0 )
        target_pitch = -target_pitch;
      target_size = (FT_ULong)target_pitch * target->rows;

      if ( target_size != size )
        (void)FT_QREALLOC( target->buffer, target_size, size );
    }
    else
      (void)FT_QALLOC( target->buffer, size );

    if ( !error )
    {
      unsigned char *p;


      p = target->buffer;
      *target = *source;
      target->buffer = p;

      if ( source_pitch_sign == target_pitch_sign )
        FT_MEM_COPY( target->buffer, source->buffer, size );
      else
      {
        /* take care of bitmap flow */
        FT_UInt   i;
        FT_Byte*  s = source->buffer;
        FT_Byte*  t = target->buffer;


        t += (FT_ULong)pitch * ( target->rows - 1 );

        for ( i = target->rows; i > 0; i-- )
        {
          FT_ARRAY_COPY( t, s, pitch );

          s += pitch;
          t -= pitch;
        }
      }
    }

    return error;
  }